

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonArrayLengthFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  bool bVar1;
  u32 uVar2;
  JsonParse *pParse;
  char *zPath;
  char *zPath_00;
  ulong val;
  
  uVar2 = 0;
  pParse = jsonParseFuncArg(ctx,*argv,0);
  if (pParse == (JsonParse *)0x0) {
    return;
  }
  bVar1 = true;
  if (argc == 2) {
    zPath = (char *)sqlite3ValueText(argv[1],'\x01');
    if (zPath == (char *)0x0) goto LAB_001b76af;
    zPath_00 = "@";
    if (*zPath == '$') {
      zPath_00 = zPath + 1;
    }
    uVar2 = jsonLookupStep(pParse,0,zPath_00,0);
    if (0xfffffffc < uVar2) {
      if (uVar2 != 0xfffffffe) {
        if (uVar2 == 0xfffffffd) {
          jsonBadPathError(ctx,zPath);
        }
        else {
          ctx->isError = 1;
          sqlite3VdbeMemSetStr
                    (ctx->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
          ;
        }
      }
      uVar2 = 0;
      bVar1 = false;
    }
  }
  if ((pParse->aBlob[uVar2] & 0xf) == 0xb) {
    uVar2 = jsonbArrayCount(pParse,uVar2);
    val = (ulong)uVar2;
  }
  else {
    val = 0;
  }
  if (bVar1) {
    pMem = ctx->pOut;
    if ((pMem->flags & 0x9000) == 0) {
      (pMem->u).i = val;
      pMem->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMem,val);
    }
  }
LAB_001b76af:
  jsonParseFree(pParse);
  return;
}

Assistant:

static void jsonArrayLengthFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  sqlite3_int64 cnt = 0;
  u32 i;
  u8 eErr = 0;

  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  if( argc==2 ){
    const char *zPath = (const char*)sqlite3_value_text(argv[1]);
    if( zPath==0 ){
      jsonParseFree(p);
      return;
    }
    i = jsonLookupStep(p, 0, zPath[0]=='$' ? zPath+1 : "@", 0);
    if( JSON_LOOKUP_ISERROR(i) ){
      if( i==JSON_LOOKUP_NOTFOUND ){
        /* no-op */
      }else if( i==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      eErr = 1;
      i = 0;
    }
  }else{
    i = 0;
  }
  if( (p->aBlob[i] & 0x0f)==JSONB_ARRAY ){
    cnt = jsonbArrayCount(p, i);
  }
  if( !eErr ) sqlite3_result_int64(ctx, cnt);
  jsonParseFree(p);
}